

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O0

value_type __thiscall
TFadBinaryMul<TFadExpr<TFadFuncSin<TFad<6,_double>_>_>,_TFad<6,_double>_>::dx
          (TFadBinaryMul<TFadExpr<TFadFuncSin<TFad<6,_double>_>_>,_TFad<6,_double>_> *this,int i)

{
  double dVar1;
  double *pdVar2;
  int in_ESI;
  TFadExpr<TFadFuncSin<TFad<6,_double>_>_> *in_RDI;
  value_type vVar3;
  double dVar4;
  value_type vVar5;
  int in_stack_ffffffffffffffcc;
  
  vVar3 = TFadExpr<TFadFuncSin<TFad<6,_double>_>_>::dx(in_RDI,in_stack_ffffffffffffffcc);
  pdVar2 = TFad<6,_double>::val((TFad<6,_double> *)(in_RDI->fadexpr_).expr_.val_);
  dVar1 = *pdVar2;
  dVar4 = TFad<6,_double>::dx((TFad<6,_double> *)(in_RDI->fadexpr_).expr_.val_,in_ESI);
  vVar5 = TFadExpr<TFadFuncSin<TFad<6,_double>_>_>::val
                    ((TFadExpr<TFadFuncSin<TFad<6,_double>_>_> *)0x14e4969);
  return vVar3 * dVar1 + dVar4 * vVar5;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}